

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<int> __l;
  bool bVar1;
  iterator iVar2;
  iterator iVar3;
  reference piVar4;
  ostream *poVar5;
  iterator iStack_150;
  int a_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<int,_std::allocator<int>_> *__range1_3;
  iterator iStack_118;
  int a_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<int,_std::allocator<int>_> *__range1_2;
  iterator iStack_e0;
  int a_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  iterator iStack_a8;
  int a;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  allocator<int> local_69;
  int local_68 [10];
  iterator local_40;
  size_type local_38;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> s;
  char **argv_local;
  int argc_local;
  
  local_68[8] = 0;
  local_68[9] = 3;
  local_68[4] = 8;
  local_68[5] = 6;
  local_68[6] = 1;
  local_68[7] = 9;
  local_68[0] = 5;
  local_68[1] = 7;
  local_68[2] = 4;
  local_68[3] = 2;
  local_40 = local_68;
  local_38 = 10;
  s.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)argv;
  std::allocator<int>::allocator(&local_69);
  __l._M_len = local_38;
  __l._M_array = local_40;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_30,__l,&local_69);
  std::allocator<int>::~allocator(&local_69);
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_30);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_30)
  ;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar2._M_current,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar3._M_current);
  __end1 = std::vector<int,_std::allocator<int>_>::begin
                     ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_a8 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff58);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar5," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_30);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_30)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::greater<int>>
            (iVar2._M_current,iVar3._M_current);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_e0 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffff20);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar5," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_30);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_30)
  ;
  std::
  sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,main::customLess>
            (iVar2._M_current,iVar3._M_current);
  __end1_2 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_118 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_2,&stack0xfffffffffffffee8);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_2);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar5," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_2);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  iVar2 = std::vector<int,_std::allocator<int>_>::begin
                    ((vector<int,_std::allocator<int>_> *)local_30);
  iVar3 = std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)local_30)
  ;
  std::sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,main::__0>
            (iVar2._M_current,iVar3._M_current);
  __end1_3 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)local_30);
  iStack_150 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)local_30);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end1_3,&stack0xfffffffffffffeb0);
    if (!bVar1) break;
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_3);
    poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,*piVar4);
    std::operator<<(poVar5," ");
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_3);
  }
  std::operator<<((ostream *)&std::cout,"\n");
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	// std::array<int, 10> s = {5, 7, 4, 2, 8, 6, 1, 9, 0, 3};
	std::vector<int> s = {5, 7, 4, 2, 8, 6, 1, 9, 0, 3};

	// sort using the default operator<
	std::sort(s.begin(), s.end());
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	std::sort(s.begin(), s.end(), std::greater<int>());
		for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	// sort using a custom function object
	struct customLess
	{
		bool operator()(int a, int b) { return a < b; }
	};
	std::sort(s.begin(), s.end(), customLess());
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";

	// sort using a lambda expression
	std::sort(s.begin(), s.end(), [](int a, int b) {
		return b < a;
	});
	for (auto a : s) {
		std::cout << a << " ";
	}
	std::cout << "\n";
	return 0;
}